

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Get_MM_Var(T1_Face face,FT_MM_Var **master)

{
  FT_Memory memory;
  PS_Blend pPVar1;
  char *__s1;
  int iVar2;
  FT_MM_Var *pFVar3;
  long lVar4;
  undefined8 uVar5;
  FT_Fixed FVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  FT_Fixed *axiscoords_00;
  FT_Error error;
  FT_MM_Var **local_c8;
  FT_Multi_Master mmaster;
  FT_Fixed axiscoords [4];
  
  memory = (face->root).memory;
  pPVar1 = face->blend;
  error = T1_Get_Multi_Master(face,&mmaster);
  if (error == 0) {
    pFVar3 = (FT_MM_Var *)ft_mem_alloc(memory,(ulong)mmaster.num_axis * 0x30 + 0x20,&error);
    if (error == 0) {
      pFVar3->num_axis = mmaster.num_axis;
      pFVar3->num_designs = mmaster.num_designs;
      pFVar3->num_namedstyles = 0;
      pFVar3->axis = (FT_Var_Axis *)(pFVar3 + 1);
      pFVar3->namedstyle = (FT_Var_Named_Style *)0x0;
      lVar9 = (ulong)mmaster.num_axis * 0x18;
      local_c8 = master;
      for (lVar8 = 0; lVar9 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        __s1 = *(char **)((long)&mmaster.axis[0].name + lVar8);
        *(char **)((long)&pFVar3[1].num_axis + lVar8 * 2) = __s1;
        lVar4 = *(long *)((long)&mmaster.axis[0].minimum + lVar8) * 0x10000;
        *(long *)((long)&pFVar3[1].num_namedstyles + lVar8 * 2) = lVar4;
        lVar7 = *(long *)((long)&mmaster.axis[0].maximum + lVar8) * 0x10000;
        *(long *)((long)&pFVar3[1].namedstyle + lVar8 * 2) = lVar7;
        *(long *)((long)&pFVar3[1].axis + lVar8 * 2) = lVar7 + lVar4 >> 1;
        *(undefined4 *)((long)&pFVar3[2].num_namedstyles + lVar8 * 2) = 0xffffffff;
        *(undefined8 *)((long)&pFVar3[2].num_axis + lVar8 * 2) = 0xffffffff;
        if (__s1 != (char *)0x0) {
          iVar2 = strcmp(__s1,"Weight");
          if (iVar2 == 0) {
            uVar5 = 0x77676874;
          }
          else {
            iVar2 = strcmp(__s1,"Width");
            if (iVar2 == 0) {
              uVar5 = 0x77647468;
            }
            else {
              iVar2 = strcmp(__s1,"OpticalSize");
              if (iVar2 != 0) goto LAB_001714ce;
              uVar5 = 0x6f70737a;
            }
          }
          *(undefined8 *)((long)&pFVar3[2].num_axis + lVar8 * 2) = uVar5;
        }
LAB_001714ce:
      }
      if (pPVar1->num_designs == 1 << ((byte)pPVar1->num_axis & 0x1f)) {
        axiscoords_00 = axiscoords;
        mm_weights_unmap(pPVar1->default_weight_vector,axiscoords_00,pPVar1->num_axis);
        for (lVar8 = 0; lVar9 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
          FVar6 = mm_axis_unmap((PS_DesignMap)(&pPVar1->design_map[0].num_points + lVar8),
                                *axiscoords_00);
          *(FT_Fixed *)((long)&pFVar3->axis->def + lVar8 * 2) = FVar6;
          axiscoords_00 = axiscoords_00 + 1;
        }
      }
      *local_c8 = pFVar3;
    }
  }
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Var( T1_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Memory        memory = face->root.memory;
    FT_MM_Var       *mmvar = NULL;
    FT_Multi_Master  mmaster;
    FT_Error         error;
    FT_UInt          i;
    FT_Fixed         axiscoords[T1_MAX_MM_AXIS];
    PS_Blend         blend = face->blend;


    error = T1_Get_Multi_Master( face, &mmaster );
    if ( error )
      goto Exit;
    if ( FT_ALLOC( mmvar,
                   sizeof ( FT_MM_Var ) +
                     mmaster.num_axis * sizeof ( FT_Var_Axis ) ) )
      goto Exit;

    mmvar->num_axis        = mmaster.num_axis;
    mmvar->num_designs     = mmaster.num_designs;
    mmvar->num_namedstyles = 0;                           /* Not supported */
    mmvar->axis            = (FT_Var_Axis*)&mmvar[1];
                                      /* Point to axes after MM_Var struct */
    mmvar->namedstyle      = NULL;

    for ( i = 0; i < mmaster.num_axis; i++ )
    {
      mmvar->axis[i].name    = mmaster.axis[i].name;
      mmvar->axis[i].minimum = INT_TO_FIXED( mmaster.axis[i].minimum );
      mmvar->axis[i].maximum = INT_TO_FIXED( mmaster.axis[i].maximum );
      mmvar->axis[i].def     = ( mmvar->axis[i].minimum +
                                   mmvar->axis[i].maximum ) / 2;
                            /* Does not apply.  But this value is in range */
      mmvar->axis[i].strid   = ~0U;                      /* Does not apply */
      mmvar->axis[i].tag     = ~0U;                      /* Does not apply */

      if ( !mmvar->axis[i].name )
        continue;

      if ( ft_strcmp( mmvar->axis[i].name, "Weight" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'g', 'h', 't' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Width" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'd', 't', 'h' );
      else if ( ft_strcmp( mmvar->axis[i].name, "OpticalSize" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'o', 'p', 's', 'z' );
    }

    if ( blend->num_designs == ( 1U << blend->num_axis ) )
    {
      mm_weights_unmap( blend->default_weight_vector,
                        axiscoords,
                        blend->num_axis );

      for ( i = 0; i < mmaster.num_axis; i++ )
        mmvar->axis[i].def = mm_axis_unmap( &blend->design_map[i],
                                            axiscoords[i] );
    }

    *master = mmvar;

  Exit:
    return error;
  }